

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int lj_cf_table_insert(lua_State *L)

{
  uint uVar1;
  anon_struct_8_2_fd66bcdd_for_TValue_2 aVar2;
  MSize key;
  uint key_00;
  uint uVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  GCobj *o;
  GCtab *t;
  
  pTVar5 = L->base;
  pTVar4 = L->top;
  if ((pTVar5 < pTVar4) && ((pTVar5->field_2).it == 0xfffffff4)) {
    uVar1 = (pTVar5->u32).lo;
    t = (GCtab *)(ulong)uVar1;
    key = lj_tab_len(t);
    iVar7 = (int)pTVar4 - (int)pTVar5;
    key_00 = key + 1;
    if (iVar7 != 0x10) {
      if (iVar7 != 0x18) {
        lj_err_caller(L,LJ_ERR_TABINS);
      }
      key_00 = lj_lib_checkint(L,2);
      if ((int)key_00 <= (int)key) {
        lVar9 = (long)(int)(key + 1);
        lVar8 = lVar9 * 8;
        do {
          uVar3 = t->asize;
          if (key + 1 < uVar3) {
            pTVar5 = (TValue *)((ulong)(t->array).ptr32 + lVar8);
          }
          else {
            pTVar5 = lj_tab_setinth(L,t,key + 1);
            uVar3 = t->asize;
          }
          if (key < uVar3) {
            pTVar4 = (TValue *)((ulong)(t->array).ptr32 + lVar8 + -8);
          }
          else {
            pTVar4 = lj_tab_getinth(t,key);
          }
          if (pTVar4 == (TValue *)0x0) {
            (pTVar5->field_2).it = 0xffffffff;
          }
          else {
            *pTVar5 = *pTVar4;
          }
          lVar9 = lVar9 + -1;
          key = key - 1;
          lVar8 = lVar8 + -8;
        } while ((int)key_00 < lVar9);
      }
    }
    if (key_00 < t->asize) {
      pTVar5 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)key_00 * 8);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,key_00);
    }
    aVar2 = L->top[-1].field_2;
    pTVar5->field_2 = aVar2;
    if (((aVar2.it + 0xd < 9) && ((*(byte *)(((ulong)aVar2 & 0xffffffff) + 4) & 3) != 0)) &&
       ((t->marked & 4) != 0)) {
      uVar6 = (ulong)(L->glref).ptr32;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr32 = *(uint32_t *)(uVar6 + 0x3c);
      *(uint *)(uVar6 + 0x3c) = uVar1;
    }
    return 0;
  }
  lj_err_argt(L,1,5);
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}